

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indlg_tx.c
# Opt level: O0

int tio_input_dialog(int icon_id,char *prompt,int standard_button_set,char **buttons,
                    int button_count,int default_index,int cancel_index)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ushort **ppuVar5;
  size_t sVar6;
  anon_struct_32_2_7b5b9c99 *in_RCX;
  undefined4 in_EDX;
  int in_R8D;
  bool bVar7;
  char *p2;
  char *p1;
  int last_found;
  int match_cnt;
  char *resp;
  char *cur;
  char *p;
  char buf [256];
  int i;
  int in_stack_fffffffffffffe80;
  uint in_stack_fffffffffffffe84;
  char *in_stack_fffffffffffffe98;
  byte *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  byte *local_150;
  char *local_140;
  byte local_138 [268];
  int local_2c;
  int local_24;
  anon_struct_32_2_7b5b9c99 *local_20;
  undefined4 local_14;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_14 = in_EDX;
  do {
    switch(local_14) {
    case 0:
      goto LAB_0027664e;
    case 1:
      local_2c = 0;
      break;
    case 2:
      local_2c = 1;
      break;
    case 3:
      local_2c = 2;
      break;
    case 4:
      local_2c = 3;
      break;
    default:
      return 0;
    }
    local_20 = tio_input_dialog::std_btns + local_2c;
    local_24 = tio_input_dialog::std_btns[local_2c].button_count;
LAB_0027664e:
    if (local_24 == 0) {
      return 0;
    }
    outformat((char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    outformat((char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    outformat((char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
      if (local_2c != 0) {
        outformat((char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      }
      pcVar1 = local_20->buttons[local_2c];
      local_140 = pcVar1;
      while( true ) {
        bVar7 = false;
        if (*local_140 != '&') {
          bVar7 = *local_140 != '\0';
        }
        if (!bVar7) break;
        local_140 = local_140 + 1;
      }
      if (*local_140 == '&') {
        sprintf((char *)local_138,"%.*s(%c)%s",(ulong)(uint)((int)local_140 - (int)pcVar1),pcVar1,
                (ulong)(uint)(int)local_140[1],local_140 + 2);
        outformat((char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      }
      else {
        outformat((char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      }
    }
    iVar3 = tio_is_html_mode();
    if (iVar3 != 0) {
      outformat((char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    }
    getstring((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
              (char *)in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    iVar3 = tio_is_html_mode();
    if (iVar3 != 0) {
      outformat((char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    }
    local_150 = local_138;
    while( true ) {
      bVar7 = false;
      if (*local_150 < 0x80) {
        ppuVar5 = __ctype_b_loc();
        bVar7 = ((*ppuVar5)[(int)(uint)*local_150] & 0x2000) != 0;
      }
      if (!bVar7) break;
      local_150 = local_150 + 1;
    }
    sVar6 = strlen((char *)local_150);
    if (sVar6 == 1) {
      for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
        local_140 = local_20->buttons[local_2c];
        while( true ) {
          bVar7 = false;
          if (*local_140 != '&') {
            bVar7 = *local_140 != '\0';
          }
          if (!bVar7) break;
          local_140 = local_140 + 1;
        }
        if (*local_140 == '&') {
          iVar3 = toupper((int)local_140[1]);
          iVar4 = toupper((int)(char)*local_150);
          if (iVar3 == iVar4) {
            return local_2c + 1;
          }
        }
      }
    }
    in_stack_fffffffffffffeac = 0;
    for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
      in_stack_fffffffffffffe98 = local_20->buttons[local_2c];
      in_stack_fffffffffffffea0 = local_150;
      while( true ) {
        uVar2 = in_stack_fffffffffffffe84 & 0xffffff;
        if (*in_stack_fffffffffffffea0 != 0) {
          uVar2 = CONCAT13(*in_stack_fffffffffffffe98 != '\0',(int3)in_stack_fffffffffffffe84);
        }
        in_stack_fffffffffffffe84 = uVar2;
        if ((char)(in_stack_fffffffffffffe84 >> 0x18) == '\0') break;
        if (*in_stack_fffffffffffffe98 == '&') {
          in_stack_fffffffffffffe98 = in_stack_fffffffffffffe98 + 1;
        }
        in_stack_fffffffffffffe80 = toupper((int)(char)*in_stack_fffffffffffffea0);
        iVar3 = toupper((int)*in_stack_fffffffffffffe98);
        if (in_stack_fffffffffffffe80 != iVar3) break;
        in_stack_fffffffffffffea0 = in_stack_fffffffffffffea0 + 1;
        in_stack_fffffffffffffe98 = in_stack_fffffffffffffe98 + 1;
      }
      if (*in_stack_fffffffffffffea0 == 0) {
        in_stack_fffffffffffffeac = in_stack_fffffffffffffeac + 1;
        in_stack_fffffffffffffea8 = local_2c;
      }
    }
    if (in_stack_fffffffffffffeac == 1) {
      return in_stack_fffffffffffffea8 + 1;
    }
  } while( true );
}

Assistant:

int tio_input_dialog(int icon_id, const char *prompt,
                     int standard_button_set,
                     const char **buttons, int button_count,
                     int default_index, int cancel_index)
{
    /* ignore the icon ID - we can't display an icon in text mode */
    VARUSED(icon_id);

    /* keep going until we get a valid response */
    for (;;)
    {
        int i;
        char buf[256];
        const char *p;
        const char *cur;
        char *resp;
        int match_cnt;
        int last_found;
        static const struct
        {
            const char *buttons[3];
            int button_count;
        } std_btns[] =
        {
            { { "&OK" },                    1 },
            { { "&OK", "&Cancel" },         2 },
            { { "&Yes", "&No" },            2 },
            { { "&Yes", "&No", "&Cancel" }, 3 }
        };

        /* 
         *   if we have a standard button set selected, get our button
         *   labels 
         */
        switch(standard_button_set)
        {
        case 0:
            /* use the explicit buttons provided */
            break;

        case OS_INDLG_OK:
            i = 0;

        use_std_btns:
            /* use the selected standard button set */
            buttons = (const char **)std_btns[i].buttons;
            button_count = std_btns[i].button_count;
            break;

        case OS_INDLG_OKCANCEL:
            i = 1;
            goto use_std_btns;

        case OS_INDLG_YESNO:
            i = 2;
            goto use_std_btns;

        case OS_INDLG_YESNOCANCEL:
            i = 3;
            goto use_std_btns;

        default:
            /* 
             *   we don't recognize other standard button sets - return an
             *   error 
             */
            return 0;
        }

        /* 
         *   if there are no buttons defined, they'll never be able to
         *   respond, so we'd just loop forever - rather than let that
         *   happen, return failure 
         */
        if (button_count == 0)
            return 0;

        /* display a newline and the prompt string */
        outformat("\\n");
        outformat((char *)prompt);
        outformat(" ");

        /* display the response */
        for (i = 0 ; i < button_count ; ++i)
        {
            /* 
             *   display a slash to separate responses, if this isn't the
             *   first one 
             */
            if (i != 0)
                outformat("/");

            /* get the current button */
            cur = buttons[i];

            /* 
             *   Look for a "&" in the response string.  If we find it,
             *   remove the "&" and enclose the shortcut key in parens.  
             */
            for (p = cur ; *p != '&' && *p != '\0' ; ++p) ;

            /* if we found the "&", put the next character in parens */
            if (*p == '&')
            {
                /* reformat the response string */
                sprintf(buf, "%.*s(%c)%s", (int)(p - cur), cur, *(p+1), p+2);

                /* display it */
                outformat(buf);
            }
            else
            {
                /* no '&' - just display the response string as-is */
                outformat((char *)cur);
            }
        }

        /* if we're in HTML mode, switch to input font */
        if (tio_is_html_mode())
            outformat("<font face='TADS-Input'>");

        /* read the response */
        getstring(" >", buf, sizeof(buf));

        /* if we're in HTML mode, close the input font tag */
        if (tio_is_html_mode())
            outformat("</font>");

        /* skip any leading spaces in the reply */
        for (resp = buf ; t_isspace(*resp) ; ++resp) ;

        /* if it's one character, check it against the shortcut keys */
        if (strlen(resp) == 1)
        {
            /* scan the responses */
            for (i = 0 ; i < button_count ; ++i)
            {
                /* look for a '&' in this button */
                for (p = buttons[i] ; *p != '&' && *p != '\0' ; ++p) ;

                /* if we found the '&', check the shortcut */
                if (*p == '&' && toupper(*(p+1)) == toupper(*resp))
                {
                    /* 
                     *   this is the one - return the current index
                     *   (bumping it by one to get a 1-based value) 
                     */
                    return i + 1;
                }
            }
        }

        /* 
         *   Either it's not a one-character reply, or it didn't match a
         *   short-cut - check it against the leading substrings of the
         *   responses.  If it matches exactly one of the responses in its
         *   leading substring, use that response.  
         */
        for (i = 0, match_cnt = 0 ; i < button_count ; ++i)
        {
            const char *p1;
            const char *p2;

            /* 
             *   compare this response to the user's response; skip any
             *   '&' in the button label 
             */
            for (p1 = resp, p2 = buttons[i] ; *p1 != '\0' && *p2 != '\0' ;
                 ++p1, ++p2)
            {
                /* if this is a '&' in the button label, skip it */
                if (*p2 == '&')
                    ++p2;

                /* if these characters don't match, it's no match */
                if (toupper(*p1) != toupper(*p2))
                    break;
            }

            /* 
             *   if we reached the end of the user's response, we have a
             *   match in the leading substring - count it and remember
             *   this as the last one, but keep looking, since we need to
             *   make sure we don't have any other matches 
             */
            if (*p1 == '\0')
            {
                ++match_cnt;
                last_found = i;
            }
        }
        
        /* 
         *   if we found exactly one match, return it (adjusting to a
         *   1-based index); if we found more or less than one match, it's
         *   not a valid response, so start over with a new prompt 
         */
        if (match_cnt == 1)
            return last_found + 1;
    }
}